

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Route.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Route::getRoutePOIs(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Route *this)

{
  bool bVar1;
  reference ppVar2;
  undefined8 uStack_48;
  pair<int,_double> dp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1;
  Route *this_local;
  vector<int,_std::allocator<int>_> *POIs;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                     (&this->route);
  dp.second = (double)std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ::end(&this->route);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                     *)&dp.second), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator*(&__end1);
    uStack_48 = *(undefined8 *)ppVar2;
    dp._0_8_ = ppVar2->second;
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict *)&uStack_48);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Route::getRoutePOIs() const {
    vector<int> POIs;
    for (auto dp : route) {
        POIs.push_back(dp.first);
    }
    return POIs;
}